

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcRobustBufferAccessBehaviorTests.cpp
# Opt level: O3

void deqp::RobustBufferAccessBehavior::Program::Link(Functions *gl,GLuint id)

{
  GLenum GVar1;
  TestError *this;
  GLint length;
  GLint status;
  string message;
  GLint local_48;
  GLint local_44;
  GLchar *local_40;
  undefined8 local_38;
  GLchar local_30 [16];
  
  local_44 = 0;
  (*gl->linkProgram)(id);
  GVar1 = (*gl->getError)();
  glu::checkError(GVar1,"LinkProgram",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcRobustBufferAccessBehaviorTests.cpp"
                  ,0x1b9);
  (*gl->getProgramiv)(id,0x8b82,&local_44);
  GVar1 = (*gl->getError)();
  glu::checkError(GVar1,"GetProgramiv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcRobustBufferAccessBehaviorTests.cpp"
                  ,0x1bd);
  if (local_44 == 1) {
    return;
  }
  local_48 = 0;
  local_40 = local_30;
  local_38 = 0;
  local_30[0] = '\0';
  (*gl->getProgramiv)(id,0x8b84,&local_48);
  GVar1 = (*gl->getError)();
  glu::checkError(GVar1,"GetProgramiv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcRobustBufferAccessBehaviorTests.cpp"
                  ,0x1c7);
  std::__cxx11::string::resize((ulong)&local_40,(char)local_48);
  (*gl->getProgramInfoLog)(id,local_48,(GLsizei *)0x0,local_40);
  GVar1 = (*gl->getError)();
  glu::checkError(GVar1,"GetProgramInfoLog",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcRobustBufferAccessBehaviorTests.cpp"
                  ,0x1cd);
  this = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this,local_40,(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcRobustBufferAccessBehaviorTests.cpp"
             ,0x1cf);
  __cxa_throw(this,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void Program::Link(const glw::Functions& gl, glw::GLuint id)
{
	GLint status = GL_FALSE;

	gl.linkProgram(id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "LinkProgram");

	/* Get link status */
	gl.getProgramiv(id, GL_LINK_STATUS, &status);
	GLU_EXPECT_NO_ERROR(gl.getError(), "GetProgramiv");

	/* Log link error */
	if (GL_TRUE != status)
	{
		glw::GLint  length = 0;
		std::string message;

		/* Get error log length */
		gl.getProgramiv(id, GL_INFO_LOG_LENGTH, &length);
		GLU_EXPECT_NO_ERROR(gl.getError(), "GetProgramiv");

		message.resize(length, 0);

		/* Get error log */
		gl.getProgramInfoLog(id, length, 0, &message[0]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "GetProgramInfoLog");

		TCU_FAIL(message.c_str());
	}
}